

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.c
# Opt level: O1

intptr_t ArrayFindEx(array *p,size_t Count,size_t Width,void *Data,arraycmp Cmp,void *CmpParam,
                    bool_t *Found)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  char *__s1;
  bool_t bVar4;
  
  if (p == (array *)0x0) {
    __assert_fail("&(*p)!=NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                  ,0x1be,
                  "intptr_t ArrayFindEx(const array *, size_t, size_t, const void *, arraycmp, const void *, bool_t *)"
                 );
  }
  uVar3 = p->_Used;
  if (uVar3 == 0) {
    *Found = 0;
    Count = 0;
  }
  else {
    if ((Count == 0xffffffffffffffff) && (Count = uVar3 / Width, Count * Width - uVar3 != 0)) {
      __assert_fail("Count*Width == ArraySize(p)",
                    "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/array/array.c"
                    ,0x1c7,
                    "intptr_t ArrayFindEx(const array *, size_t, size_t, const void *, arraycmp, const void *, bool_t *)"
                   );
    }
    if (Cmp == (arraycmp)0x0) {
      if (Count == 0) {
        Count = 0;
        bVar4 = 0;
      }
      else {
        __s1 = p->_Begin;
        bVar4 = 0;
        uVar3 = 0;
        do {
          iVar1 = bcmp(__s1,Data,Width);
          if (iVar1 == 0) {
            bVar4 = 1;
            Count = uVar3;
            break;
          }
          __s1 = __s1 + Width;
          uVar3 = uVar3 + 1;
        } while (Count != uVar3);
      }
      *Found = bVar4;
    }
    else {
      lVar2 = Count - 1;
      if (lVar2 < 0) {
        Count = 0;
        uVar3 = 0;
      }
      else {
        uVar3 = 0;
        do {
          Count = lVar2 + uVar3 >> 1;
          iVar1 = (*Cmp)(CmpParam,p->_Begin + Count * Width,Data);
          if (iVar1 < 1) {
            if (-1 < iVar1) {
              *Found = 1;
              return Count;
            }
            uVar3 = Count + 1;
          }
          else {
            lVar2 = Count - 1;
          }
        } while ((long)uVar3 <= lVar2);
      }
      *Found = 0;
      if (lVar2 != Count - 1) {
        Count = uVar3;
      }
    }
  }
  return Count;
}

Assistant:

intptr_t ArrayFindEx(const array* p, size_t Count, size_t Width, const void* Data, arraycmp Cmp, const void* CmpParam, bool_t* Found)
{
    if (ARRAYEMPTY(*p))
    {
        *Found = 0;
        return 0;
    }

    if (Count == ARRAY_AUTO_COUNT)
    {
        Count = ArraySize(p)/Width;
        assert(Count*Width == ArraySize(p));
    }

    if (Cmp)
    {
        int i;
        intptr_t Mid = 0;
        intptr_t Lower = 0;
        intptr_t Upper = Count-1;

        while (Upper >= Lower)
        {
            Mid = (Upper + Lower) >> 1;

            i = Cmp(CmpParam, ARRAYBEGIN(*p,uint8_t) + Width*Mid, Data);
            if (i>0)
                Upper = Mid-1;
            else if (i<0)
                Lower = Mid+1;
            else
            {
                *Found = 1;
                return Mid;
            }
        }

        *Found = 0;

        if (Upper == Mid - 1)
            return Mid;
        else
            return Lower;
    }
    else
    {
        intptr_t No = 0;
        const char* i;
        for (i=p->_Begin;Count--;i+=Width,++No)
            if (memcmp(i,Data,Width)==0)
            {
                *Found = 1;
                return No;
            }

        *Found = 0;
        return No;
    }
}